

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParseRow(TidyDocImpl *doc,Node *row,GetTokenMode mode)

{
  Lexer *pLVar1;
  Bool BVar2;
  TidyTagId local_44;
  Node *pNStack_30;
  Bool exclude_state;
  Node *node;
  Lexer *lexer;
  GetTokenMode mode_local;
  Node *row_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  if ((row->tag->model & 1) == 0) {
LAB_001334c9:
    pNStack_30 = prvTidyGetToken(doc,IgnoreWhitespace);
    if (pNStack_30 != (Node *)0x0) {
      if (pNStack_30->tag == row->tag) {
        if (pNStack_30->type == EndTag) {
          prvTidyFreeNode(doc,pNStack_30);
          row->closed = yes;
          FixEmptyRow(doc,row);
          return;
        }
        prvTidyUngetToken(doc);
        FixEmptyRow(doc,row);
        return;
      }
      if (pNStack_30->type == EndTag) {
        BVar2 = prvTidynodeHasCM(pNStack_30,0x82);
        if ((BVar2 != no) ||
           (((pNStack_30 != (Node *)0x0 && (pNStack_30->tag != (Dict *)0x0)) &&
            (pNStack_30->tag->id == TidyTag_TABLE)))) {
          if ((pNStack_30 == (Node *)0x0) || (pNStack_30->tag == (Dict *)0x0)) {
            local_44 = TidyTag_UNKNOWN;
          }
          else {
            local_44 = pNStack_30->tag->id;
          }
          BVar2 = DescendantOf(row,local_44);
          if (BVar2 != no) {
            prvTidyUngetToken(doc);
            return;
          }
        }
        if ((((pNStack_30 == (Node *)0x0) || (pNStack_30->tag == (Dict *)0x0)) ||
            (pNStack_30->tag->id != TidyTag_FORM)) &&
           (BVar2 = prvTidynodeHasCM(pNStack_30,0x18), BVar2 == no)) {
          if ((((pNStack_30 == (Node *)0x0) || (pNStack_30->tag == (Dict *)0x0)) ||
              (pNStack_30->tag->id != TidyTag_TD)) &&
             (((pNStack_30 == (Node *)0x0 || (pNStack_30->tag == (Dict *)0x0)) ||
              (pNStack_30->tag->id != TidyTag_TH)))) goto LAB_001336bc;
          prvTidyReportError(doc,row,pNStack_30,0xd0);
          prvTidyFreeNode(doc,pNStack_30);
        }
        else {
          if (((pNStack_30 != (Node *)0x0) && (pNStack_30->tag != (Dict *)0x0)) &&
             (pNStack_30->tag->id == TidyTag_FORM)) {
            BadForm(doc);
          }
          prvTidyReportError(doc,row,pNStack_30,0xd0);
          prvTidyFreeNode(doc,pNStack_30);
        }
      }
      else {
LAB_001336bc:
        BVar2 = InsertMisc(row,pNStack_30);
        if (BVar2 == no) {
          if ((pNStack_30->tag == (Dict *)0x0) && (pNStack_30->type != TextNode)) {
            prvTidyReportError(doc,row,pNStack_30,0xd0);
            prvTidyFreeNode(doc,pNStack_30);
          }
          else if (((pNStack_30 == (Node *)0x0) || (pNStack_30->tag == (Dict *)0x0)) ||
                  (pNStack_30->tag->id != TidyTag_TABLE)) {
            BVar2 = prvTidynodeHasCM(pNStack_30,0x100);
            if (BVar2 != no) {
              prvTidyUngetToken(doc);
              return;
            }
            if (pNStack_30->type != EndTag) {
              if (pNStack_30->type != EndTag) {
                if (((pNStack_30 == (Node *)0x0) || (pNStack_30->tag == (Dict *)0x0)) ||
                   (pNStack_30->tag->id != TidyTag_FORM)) {
                  BVar2 = prvTidynodeIsText(pNStack_30);
                  if ((BVar2 != no) || (BVar2 = prvTidynodeHasCM(pNStack_30,0x18), BVar2 != no)) {
                    MoveBeforeTable(doc,row,pNStack_30);
                    prvTidyReportError(doc,row,pNStack_30,0xd3);
                    pLVar1->exiled = yes;
                    BVar2 = pLVar1->excludeBlocks;
                    pLVar1->excludeBlocks = no;
                    if (pNStack_30->type != TextNode) {
                      ParseTag(doc,pNStack_30,IgnoreWhitespace);
                    }
                    pLVar1->exiled = no;
                    pLVar1->excludeBlocks = BVar2;
                    goto LAB_001334c9;
                  }
                  if ((pNStack_30->tag->model & 4) != 0) {
                    prvTidyReportError(doc,row,pNStack_30,0xd3);
                    MoveToHead(doc,row,pNStack_30);
                    goto LAB_001334c9;
                  }
                }
                else {
                  prvTidyUngetToken(doc);
                  pNStack_30 = prvTidyInferredTag(doc,TidyTag_TD);
                  prvTidyReportError(doc,row,pNStack_30,0xd4);
                }
              }
              if ((((pNStack_30 == (Node *)0x0) || (pNStack_30->tag == (Dict *)0x0)) ||
                  (pNStack_30->tag->id != TidyTag_TD)) &&
                 (((pNStack_30 == (Node *)0x0 || (pNStack_30->tag == (Dict *)0x0)) ||
                  (pNStack_30->tag->id != TidyTag_TH)))) {
                prvTidyReportError(doc,row,pNStack_30,0xd3);
                prvTidyFreeNode(doc,pNStack_30);
              }
              else {
                prvTidyInsertNodeAtEnd(row,pNStack_30);
                BVar2 = pLVar1->excludeBlocks;
                pLVar1->excludeBlocks = no;
                ParseTag(doc,pNStack_30,IgnoreWhitespace);
                pLVar1->excludeBlocks = BVar2;
                while (pLVar1->istackbase < pLVar1->istacksize) {
                  prvTidyPopInline(doc,(Node *)0x0);
                }
              }
              goto LAB_001334c9;
            }
            prvTidyReportError(doc,row,pNStack_30,0xd0);
            prvTidyFreeNode(doc,pNStack_30);
          }
          else {
            prvTidyReportError(doc,row,pNStack_30,0xd0);
            prvTidyFreeNode(doc,pNStack_30);
          }
        }
      }
      goto LAB_001334c9;
    }
  }
  return;
}

Assistant:

void TY_(ParseRow)(TidyDocImpl* doc, Node *row, GetTokenMode ARG_UNUSED(mode))
{
    Lexer* lexer = doc->lexer;
    Node *node;
    Bool exclude_state;

    if (row->tag->model & CM_EMPTY)
        return;

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == row->tag)
        {
            if (node->type == EndTag)
            {
                TY_(FreeNode)( doc, node);
                row->closed = yes;
                FixEmptyRow( doc, row);
                return;
            }

            /* New row start implies end of current row */
            TY_(UngetToken)( doc );
            FixEmptyRow( doc, row);
            return;
        }

        /* 
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if ( node->type == EndTag )
        {
            if ( (TY_(nodeHasCM)(node, CM_HTML|CM_TABLE) || nodeIsTABLE(node))
                 && DescendantOf(row, TagId(node)) )
            {
                TY_(UngetToken)( doc );
                return;
            }

            if ( nodeIsFORM(node) || TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
            {
                if ( nodeIsFORM(node) )
                    BadForm( doc );

                TY_(ReportError)(doc, row, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            if ( nodeIsTD(node) || nodeIsTH(node) )
            {
                TY_(ReportError)(doc, row, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }
        }

        /* deal with comments etc. */
        if (InsertMisc(row, node))
            continue;

        /* discard unknown tags */
        if (node->tag == NULL && node->type != TextNode)
        {
            TY_(ReportError)(doc, row, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* discard unexpected <table> element */
        if ( nodeIsTABLE(node) )
        {
            TY_(ReportError)(doc, row, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* THEAD, TFOOT or TBODY */
        if ( TY_(nodeHasCM)(node, CM_ROWGRP) )
        {
            TY_(UngetToken)( doc );
            return;
        }

        if (node->type == EndTag)
        {
            TY_(ReportError)(doc, row, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /*
          if text or inline or block move before table
          if head content move to head
        */

        if (node->type != EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_TD);
                TY_(ReportError)(doc, row, node, MISSING_STARTTAG);
            }
            else if ( TY_(nodeIsText)(node)
                      || TY_(nodeHasCM)(node, CM_BLOCK | CM_INLINE) )
            {
                MoveBeforeTable( doc, row, node );
                TY_(ReportError)(doc, row, node, TAG_NOT_ALLOWED_IN);
                lexer->exiled = yes;
                exclude_state = lexer->excludeBlocks;
                lexer->excludeBlocks = no;

                if (node->type != TextNode)
                    ParseTag( doc, node, IgnoreWhitespace);

                lexer->exiled = no;
                lexer->excludeBlocks = exclude_state;
                continue;
            }
            else if (node->tag->model & CM_HEAD)
            {
                TY_(ReportError)(doc, row, node, TAG_NOT_ALLOWED_IN);
                MoveToHead( doc, row, node);
                continue;
            }
        }

        if ( !(nodeIsTD(node) || nodeIsTH(node)) )
        {
            TY_(ReportError)(doc, row, node, TAG_NOT_ALLOWED_IN);
            TY_(FreeNode)( doc, node);
            continue;
        }
        
        /* node should be <TD> or <TH> */
        TY_(InsertNodeAtEnd)(row, node);
        exclude_state = lexer->excludeBlocks;
        lexer->excludeBlocks = no;
        ParseTag( doc, node, IgnoreWhitespace);
        lexer->excludeBlocks = exclude_state;

        /* pop inline stack */

        while ( lexer->istacksize > lexer->istackbase )
            TY_(PopInline)( doc, NULL );
    }

}